

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void canvas_msg(_glist *gl,t_symbol *s,int argc,t_atom *argv)

{
  t_symbol *x_00;
  int iVar1;
  _outlet *p_Var2;
  _binbuf *p_Var3;
  _clock *p_Var4;
  t_symbol *sel;
  _glist *p_Var5;
  _glist *x_01;
  void *data;
  t_float tVar6;
  int local_44;
  int local_40;
  int nobj;
  int indx;
  int ypix;
  int xpix;
  int connectme;
  t_message *x;
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_symbol *s_local;
  _glist *gl_local;
  
  x = (t_message *)argv;
  argv_local._4_4_ = argc;
  ptStack_18 = s;
  s_local = (t_symbol *)gl;
  _xpix = (t_object *)pd_new(message_class);
  _xpix[1].te_g.g_pd = messresponder_class;
  p_Var2 = outlet_new(_xpix,&s_float);
  _xpix[1].te_g.g_next = (_gobj *)p_Var2;
  _xpix->te_width = 0;
  _xpix->field_0x2e = _xpix->field_0x2e & 0xfc | 2;
  p_Var3 = binbuf_new();
  _xpix->te_binbuf = p_Var3;
  _xpix[1].te_binbuf = (_binbuf *)s_local;
  p_Var4 = clock_new(_xpix,message_tick);
  _xpix[1].te_outlet = (_outlet *)p_Var4;
  if (argv_local._4_4_ < 2) {
    iVar1 = glist_isvisible((_glist *)s_local);
    if (iVar1 == 0) {
      post("unable to create stub message in closed canvas!");
    }
    else {
      canvas_howputnew((_glist *)s_local,&ypix,&indx,&nobj,&local_40,&local_44);
      x_00 = s_local;
      sel = gensym("editmode");
      pd_vmess((t_pd *)x_00,sel,"i",1);
      _xpix->te_xpix = (short)indx;
      _xpix->te_ypix = (short)nobj;
      glist_add((_glist *)s_local,&_xpix->te_g);
      glist_noselect((_glist *)s_local);
      glist_select((_glist *)s_local,&_xpix->te_g);
      gobj_activate(&_xpix->te_g,(_glist *)s_local,1);
      if (ypix == 0) {
        p_Var5 = glist_getcanvas((_glist *)s_local);
        canvas_startmotion(p_Var5);
      }
      else {
        canvas_connect((_glist *)s_local,(float)local_40,0.0,(float)local_44,0.0);
      }
      p_Var5 = glist_getcanvas((_glist *)s_local);
      x_01 = glist_getcanvas((_glist *)s_local);
      data = canvas_undo_set_create(x_01);
      canvas_undo_add(p_Var5,UNDO_CREATE,"create",data);
    }
  }
  else {
    tVar6 = atom_getfloatarg(0,argv_local._4_4_,(t_atom *)x);
    _xpix->te_xpix = (short)(int)tVar6;
    tVar6 = atom_getfloatarg(1,argv_local._4_4_,(t_atom *)x);
    _xpix->te_ypix = (short)(int)tVar6;
    if (2 < argv_local._4_4_) {
      binbuf_restore(_xpix->te_binbuf,argv_local._4_4_ + -2,(t_atom *)&(x->m_text).te_inlet);
    }
    glist_add((_glist *)s_local,&_xpix->te_g);
  }
  return;
}

Assistant:

void canvas_msg(t_glist *gl, t_symbol *s, int argc, t_atom *argv)
{
    t_message *x = (t_message *)pd_new(message_class);
    x->m_messresponder.mr_pd = messresponder_class;
    x->m_messresponder.mr_outlet = outlet_new(&x->m_text, &s_float);
    x->m_text.te_width = 0;                             /* don't know it yet. */
    x->m_text.te_type = T_MESSAGE;
    x->m_text.te_binbuf = binbuf_new();
    x->m_glist = gl;
    x->m_clock = clock_new(x, (t_method)message_tick);
    if (argc > 1)
    {
        x->m_text.te_xpix = atom_getfloatarg(0, argc, argv);
        x->m_text.te_ypix = atom_getfloatarg(1, argc, argv);
        if (argc > 2) binbuf_restore(x->m_text.te_binbuf, argc-2, argv+2);
        glist_add(gl, &x->m_text.te_g);
    }
    else if (!glist_isvisible(gl))
        post("unable to create stub message in closed canvas!");
    else
    {
        int connectme, xpix, ypix, indx, nobj;
        canvas_howputnew(gl, &connectme, &xpix, &ypix, &indx, &nobj);

        pd_vmess(&gl->gl_pd, gensym("editmode"), "i", 1);
        x->m_text.te_xpix = xpix;
        x->m_text.te_ypix = ypix;
        glist_add(gl, &x->m_text.te_g);
        glist_noselect(gl);
        glist_select(gl, &x->m_text.te_g);
        gobj_activate(&x->m_text.te_g, gl, 1);
        if (connectme)
            canvas_connect(gl, indx, 0, nobj, 0);
        else canvas_startmotion(glist_getcanvas(gl));
        canvas_undo_add(glist_getcanvas(gl), UNDO_CREATE, "create",
            (void *)canvas_undo_set_create(glist_getcanvas(gl)));
    }
}